

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::rebuild
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t numPrimitives,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  float fVar1;
  BBox1f BVar2;
  int iVar3;
  char cVar4;
  unsigned_long uVar5;
  runtime_error *this_00;
  long lVar6;
  size_t sVar7;
  ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pPVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  unsigned_long uVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  size_t taskCount;
  SubdivRecalculatePrimRef recalculatePrimRef;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> sum;
  SubdivPatch1 *subdiv_patches;
  Iterator<embree::SubdivMesh,_true> iter;
  BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> root;
  anon_class_1_0_00000001 local_222;
  auto_partitioner local_221;
  unsigned_long local_220;
  char **local_218;
  BVHNSubdivPatch1MBlurBuilderSAH<4> *pBStack_210;
  mvector<BBox3fa> *local_208;
  char *local_200;
  anon_class_48_6_afa08d2e_conflict2 local_1f8;
  undefined1 local_1c8;
  undefined8 local_1c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_198;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  unsigned_long local_158;
  unsigned_long uStack_150;
  size_t local_148;
  ulong uStack_140;
  BBox1f local_138;
  undefined8 uStack_130;
  char *local_128;
  anon_class_8_1_4d25ca37_conflict local_120;
  anon_class_8_1_898bcfc2_conflict10 local_118;
  undefined **local_110;
  Scene *local_108;
  Iterator<embree::GridMesh,_false> local_100;
  anon_class_16_2_341d598e_conflict2 local_f0;
  anon_class_8_1_89912a77 local_e0;
  char **local_d8;
  mvector<BBox3fa> **local_d0;
  NodeRef local_c8;
  undefined8 uStack_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  unsigned_long local_68;
  unsigned_long uStack_60;
  size_t local_58;
  ulong uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_178._8_8_ = local_178._0_8_;
  local_200 = (this->bvh->subdiv_patches).items;
  local_208 = &this->bounds;
  local_128 = local_200;
  FastAllocator::reset(&this->bvh->alloc);
  local_100.scene = this->scene;
  local_120.array2 = &local_100;
  local_100.all = false;
  local_1f8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8;
  local_c8.ptr = 0x7f8000007f800000;
  uStack_c0 = 0x7f8000007f800000;
  local_b8._0_8_ = 0xff800000ff800000;
  local_b8._8_8_ = 0xff800000ff800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  local_a8._8_8_ = 0x7f8000007f800000;
  local_98._0_8_ = 0xff800000ff800000;
  local_98._8_8_ = 0xff800000ff800000;
  local_88._0_8_ = 0x7f8000007f800000;
  local_88._8_8_ = 0x7f8000007f800000;
  local_78 = 0xff800000ff800000;
  uStack_70 = 0xff800000ff800000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0.0;
  fStack_44 = 1.0;
  fStack_40 = 1.0;
  fStack_3c = 0.0;
  local_f0.func = &local_e0;
  local_1f8.getSize = &local_120;
  local_1f8.func = &local_f0;
  uVar5 = (pstate->super_ParallelForForState).taskCount;
  local_1f8.taskCount = &local_220;
  local_1f8.reduction = &local_222;
  local_1b8._12_2_ = 0x401;
  local_198 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
  local_178._0_8_ = 8;
  local_220 = uVar5;
  local_1f8.state = pstate;
  local_f0.array2 = (Iterator<embree::GridMesh,_true> *)local_120.array2;
  local_e0.t0t1 = (BBox1f *)this;
  local_d8 = &local_128;
  local_d0 = &local_208;
  tbb::detail::r1::initialize((task_group_context *)&local_1b8.field_1);
  local_118.func = &local_1f8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,uVar5,1,&local_118,&local_221,(task_group_context *)&local_1b8.field_1);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_1b8.field_1);
  if (cVar4 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)&local_1b8.field_1);
  local_1b8._8_8_ = uStack_c0;
  local_1b8._0_8_ = local_c8.ptr;
  local_1a8._8_8_ = local_b8._8_8_;
  local_1a8._0_8_ = local_b8._0_8_;
  local_198._8_8_ = local_a8._8_8_;
  local_198._0_8_ = local_a8._0_8_;
  local_188._8_8_ = local_98._8_8_;
  local_188._0_8_ = local_98._0_8_;
  local_178._8_8_ = local_88._8_8_;
  local_178._0_8_ = local_88._0_8_;
  local_168._8_8_ = uStack_70;
  local_168._0_8_ = local_78;
  local_158 = local_68;
  local_138.upper = fStack_44;
  local_138.lower = local_48;
  uStack_130 = CONCAT44(fStack_3c,fStack_40);
  uStack_140 = uStack_50;
  local_148 = local_58;
  if (local_220 != 0) {
    pPVar8 = &pstate->prefix_state;
    uVar5 = local_220;
    fVar10 = fStack_40;
    fVar13 = fStack_3c;
    uVar12 = uStack_60;
    do {
      uVar15 = pPVar8->counts[0].max_num_time_segments;
      BVar2 = pPVar8->counts[0].max_time_range;
      fVar14 = pPVar8->counts[0].time_range.upper;
      pPVar8->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
      field_0 = local_1b8;
      pPVar8->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
      field_0 = local_1a8;
      pPVar8->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
      field_0 = local_198;
      pPVar8->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
      field_0 = local_188;
      pPVar8->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0 =
           local_178;
      pPVar8->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
           local_168;
      local_1b8.m128 =
           (__m128)minps(local_1b8.m128,
                         pPVar8->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds
                         .bounds0.lower.field_0);
      local_1a8.m128 =
           (__m128)maxps(local_1a8.m128,
                         pPVar8->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds
                         .bounds0.upper.field_0);
      local_198.m128 =
           (__m128)minps(local_198.m128,
                         pPVar8->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds
                         .bounds1.lower.field_0);
      local_188.m128 =
           (__m128)maxps(local_188.m128,
                         pPVar8->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds
                         .bounds1.upper.field_0);
      local_178.m128 =
           (__m128)minps(local_178.m128,
                         pPVar8->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds
                         .lower.field_0);
      local_168.m128 =
           (__m128)maxps(local_168.m128,
                         pPVar8->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds
                         .upper.field_0);
      fVar1 = pPVar8->counts[0].time_range.lower;
      fVar11 = fVar10;
      if (fVar1 <= fVar10) {
        fVar11 = fVar1;
      }
      sVar7 = local_148 + pPVar8->counts[0].num_time_segments;
      pPVar8->sums[0].object_range._begin = local_158;
      pPVar8->sums[0].object_range._end = uVar12;
      pPVar8->sums[0].num_time_segments = local_148;
      pPVar8->sums[0].max_num_time_segments = uStack_140;
      pPVar8->sums[0].max_time_range = local_138;
      pPVar8->sums[0].time_range.lower = fVar10;
      pPVar8->sums[0].time_range.upper = fVar13;
      if (fVar14 <= fVar13) {
        fVar14 = fVar13;
      }
      bVar9 = uStack_140 < uVar15;
      if (uStack_140 <= uVar15) {
        uStack_140 = uVar15;
      }
      uVar15 = CONCAT44((int)((uint)bVar9 << 0x1f) >> 0x1f,(int)((uint)bVar9 << 0x1f) >> 0x1f);
      local_138 = (BBox1f)(~uVar15 & (ulong)local_138 | (ulong)BVar2 & uVar15);
      local_158 = local_158 + pPVar8->counts[0].object_range._begin;
      uVar12 = uVar12 + pPVar8->counts[0].object_range._end;
      pPVar8 = (ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
               (pPVar8->counts + 1);
      uVar5 = uVar5 - 1;
      fVar10 = fVar11;
      fVar13 = fVar14;
      local_148 = sVar7;
    } while (uVar5 != 0);
    uStack_130 = CONCAT44(fVar14,fVar11);
  }
  uStack_150 = local_158;
  local_158 = 0;
  local_1f8.getSize = (anon_class_8_1_4d25ca37_conflict *)0x1;
  local_1f8.func = (anon_class_16_2_341d598e_conflict2 *)&DAT_3f8000003f800000;
  local_1c8 = 0;
  local_1c0 = 0x400;
  local_1f8.state =
       (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)0x4;
  local_1f8.taskCount = (size_t *)0x50;
  for (iVar3 = 0x1f; 4U >> iVar3 == 0; iVar3 = iVar3 + -1) {
  }
  local_1f8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(long)iVar3;
  local_1f8.reduction = (anon_class_1_0_00000001 *)0x1;
  lVar6 = *(long *)&(this->scene->super_AccelN).field_0x188;
  if (lVar6 != 0) {
    lVar6 = lVar6 + 0x550;
  }
  local_110 = &PTR_operator___02202970;
  local_108 = (this->bvh->scene->progressInterface).scene;
  local_218 = &local_128;
  pBStack_210 = this;
  BVHBuilderMSMBlur::
  build<embree::NodeRefPtr<4>,embree::sse2::SubdivRecalculatePrimRef,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::rebuild(unsigned_long,embree::ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>>&)::_lambda(embree::sse2::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::Scene::BuildProgressMonitorInterface>
            (&local_c8,(BVHBuilderMSMBlur *)&this->primsMB,&local_1b8,lVar6,local_208,local_200,
             &this->bvh->alloc,&local_128,this,&local_110,&local_1f8);
  BVHN<4>::set(this->bvh,local_c8,(LBBox3fa *)&local_b8.field_1,local_148);
  return;
}

Assistant:

void rebuild(size_t numPrimitives, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        SubdivPatch1* const subdiv_patches = (SubdivPatch1*) bvh->subdiv_patches.data();
        SubdivRecalculatePrimRef recalculatePrimRef(bounds,subdiv_patches);
        bvh->alloc.reset();

        Scene::Iterator<SubdivMesh,true> iter(scene);
        PrimInfoMB pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB
        {
          size_t s = 0;
          size_t sMB = 0;
          PrimInfoMB pinfo(empty);
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {
            if (!mesh->valid(f)) continue;
            
            BVH_Allocator alloc(bvh);
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              const size_t patchIndex = base.begin()+s;
              const size_t patchIndexMB = base.end()+sMB;
              assert(patchIndex < numPrimitives);

              for (size_t t=0; t<mesh->numTimeSteps; t++)
              {
                SubdivPatch1Base& patch = subdiv_patches[patchIndexMB+t];
                new (&patch) SubdivPatch1(unsigned(geomID),unsigned(f),subPatch,mesh,t,uv,edge_level,subdiv,VSIZEX);
              }
              SubdivPatch1Base& patch0 = subdiv_patches[patchIndexMB];
              patch0.root_ref.set((int64_t) GridSOA::create(&patch0,(unsigned)mesh->numTimeSteps,scene,alloc,&bounds[patchIndexMB]));
              primsMB[patchIndex] = recalculatePrimRef(patchIndexMB,mesh->time_range,mesh->numTimeSegments(),BBox1f(0.0f,1.0f));
              s++;
              sMB += mesh->numTimeSteps;
              pinfo.add_primref(primsMB[patchIndex]);
            });
          }
          pinfo.object_range._begin = s;
          pinfo.object_range._end = sMB;
          return pinfo;
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        pinfo.object_range._end = pinfo.begin();
        pinfo.object_range._begin = 0;

        auto createLeafFunc = [&] (const BVHBuilderMSMBlur::BuildRecord& current, const Allocator& alloc) -> NodeRecordMB4D {
          mvector<PrimRefMB>& prims = *current.prims.prims;
          size_t items MAYBE_UNUSED = current.prims.size();
          assert(items == 1);
          const size_t patchIndexMB = prims[current.prims.begin()].ID();
          SubdivPatch1Base& patch = subdiv_patches[patchIndexMB+0];
          NodeRef node = bvh->encodeLeaf((char*)&patch,1);
          size_t patchNumTimeSteps = scene->get<SubdivMesh>(patch.geomID())->numTimeSteps;
          const LBBox3fa lbounds = LBBox3fa([&] (size_t itime) { return bounds[patchIndexMB+itime]; }, current.prims.time_range, (float)(patchNumTimeSteps-1));
          return NodeRecordMB4D(node,lbounds,current.prims.time_range);
        };

        /* configuration for BVH build */
        BVHBuilderMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxDepth;
        settings.logBlockSize = bsr(N);
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0f;
        settings.intCost = 1.0f;
        settings.singleLeafTimeSegment = false;

        /* build hierarchy */
        auto root =
          BVHBuilderMSMBlur::build<NodeRef>(primsMB,pinfo,scene->device,
                                             recalculatePrimRef,
                                             typename BVH::CreateAlloc(bvh),
                                             typename BVH::AABBNodeMB4D::Create(),
                                             typename BVH::AABBNodeMB4D::Set(),
                                             createLeafFunc,
                                             bvh->scene->progressInterface,
                                             settings);
        
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
      }